

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O3

ssize_t __thiscall
HttpHeaderBase::send(HttpHeaderBase *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uint uVar1;
  void *pvVar2;
  ssize_t sVar3;
  int iVar4;
  void *extraout_RDX;
  undefined4 in_register_00000034;
  
  iVar4 = (int)__n;
  pvVar2 = __buf;
  if ((this->mHeaderStr)._M_string_length == 0) {
    buildHeader(this);
    pvVar2 = extraout_RDX;
  }
  if (__buf != (void *)0x0) {
    pvVar2 = operator_new__((this->mHeaderStr)._M_string_length + (long)iVar4,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpHeaderBase.cpp"
                            ,0x6b);
    memcpy(pvVar2,(this->mHeaderStr)._M_dataplus._M_p,(this->mHeaderStr)._M_string_length);
    memcpy((void *)((this->mHeaderStr)._M_string_length + (long)pvVar2),__buf,(long)iVar4);
    uVar1 = (**(code **)(*(long *)CONCAT44(in_register_00000034,__fd) + 0x18))
                      ((long *)CONCAT44(in_register_00000034,__fd),pvVar2,
                       iVar4 + (int)(this->mHeaderStr)._M_string_length);
    if (pvVar2 != (void *)0x0) {
      operator_delete__(pvVar2);
    }
    return (ulong)uVar1;
  }
  sVar3 = send(this,__fd,pvVar2,__n,__flags);
  return sVar3;
}

Assistant:

int HttpHeaderBase::send(IReaderWriter *writer, const uint8_t* data, int len) const
{
	TRACE_BEGIN(LOG_LVL_INFO);
	
	if (mHeaderStr.empty())
	{
		buildHeader();
	}
	
	if (not data) 
	{
		return send(writer);
	}
	
	uint8_t* temp = jh_new uint8_t[mHeaderStr.size() + len];
	memcpy(temp, mHeaderStr.c_str(), mHeaderStr.size());
	memcpy(temp + mHeaderStr.size(), data, len);
	
	int res = writer->write(temp, mHeaderStr.size() + len);
	delete[] temp;
	return res;
}